

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

CAmount __thiscall wallet::CWallet::GetDebit(CWallet *this,CTxIn *txin,isminefilter *filter)

{
  long lVar1;
  isminetype iVar2;
  const_iterator cVar3;
  ulong uVar4;
  CAmount CVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  cVar3 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,(key_type *)txin);
  if (cVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
      (__node_type *)0x0) {
    uVar4 = (ulong)(txin->prevout).n;
    lVar1 = *(long *)(*(long *)((long)cVar3.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x18);
    uVar6 = (*(long *)(*(long *)((long)cVar3.
                                       super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                       ._M_cur + 0x1c0) + 0x20) - lVar1 >> 3) * -0x3333333333333333;
    if (uVar4 <= uVar6 && uVar6 - uVar4 != 0) {
      iVar2 = IsMine(this,(CScript *)(lVar1 + uVar4 * 0x28 + 8));
      if ((*filter & iVar2) != ISMINE_NO) {
        CVar5 = *(CAmount *)
                 (*(long *)(*(long *)((long)cVar3.
                                            super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                            ._M_cur + 0x1c0) + 0x18) +
                 (ulong)(txin->prevout).n * 0x28);
        goto LAB_00c4bae4;
      }
    }
  }
  CVar5 = 0;
LAB_00c4bae4:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return CVar5;
  }
  __stack_chk_fail();
}

Assistant:

CAmount CWallet::GetDebit(const CTxIn &txin, const isminefilter& filter) const
{
    {
        LOCK(cs_wallet);
        const auto mi = mapWallet.find(txin.prevout.hash);
        if (mi != mapWallet.end())
        {
            const CWalletTx& prev = (*mi).second;
            if (txin.prevout.n < prev.tx->vout.size())
                if (IsMine(prev.tx->vout[txin.prevout.n]) & filter)
                    return prev.tx->vout[txin.prevout.n].nValue;
        }
    }
    return 0;
}